

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone_partitioning.cc
# Opt level: O1

void __thiscall
PolygonTriangulation::build_monotone_chains
          (PolygonTriangulation *this,Monochain_t *monochain,uint32_t trapezoid_index,
          uint32_t from_index,bool go_down)

{
  Trapezoid_t *trapezoid;
  uint32_t uVar1;
  uint32_t uVar2;
  _Bit_type *p_Var3;
  ulong uVar4;
  uint trapezoid_index_00;
  PolygonTriangulation *this_00;
  
  while( true ) {
    trapezoid_index_00 = trapezoid_index;
    if (trapezoid_index_00 == 0xffffffff) {
      return;
    }
    p_Var3 = (this->visited_trapezoids_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar4 = p_Var3[trapezoid_index_00 >> 6];
    if ((uVar4 >> ((ulong)trapezoid_index_00 & 0x3f) & 1) != 0) break;
    this_00 = (PolygonTriangulation *)(uVar4 | 1L << ((byte)trapezoid_index_00 & 0x3f));
    p_Var3[trapezoid_index_00 >> 6] = (_Bit_type)this_00;
    trapezoid = (this->trapezoids_).
                super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
                ._M_impl.super__Vector_impl_data._M_start + trapezoid_index_00;
    uVar1 = trapezoid->above1;
    uVar2 = trapezoid->below1;
    add_vertex_to_monochain(this_00,trapezoid,go_down,monochain);
    select_monotone_path(this,trapezoid_index_00,go_down,uVar2 == from_index || uVar1 == from_index)
    ;
    build_monotone_chains
              (this,monochain,(&trapezoid->above1)[(ulong)go_down * 2],trapezoid_index_00,go_down);
    trapezoid_index = (&trapezoid->above2)[(ulong)go_down * 2];
    from_index = trapezoid_index_00;
  }
  return;
}

Assistant:

void PolygonTriangulation::build_monotone_chains(
    Monochain_t *monochain,
    const uint32_t trapezoid_index,
    const uint32_t from_index,
    const bool go_down
) {
  if ((kInvalidIndex == trapezoid_index)
   || (visited_trapezoids_[trapezoid_index])) {
    return;
  }
  visited_trapezoids_[trapezoid_index] = true;

  const auto &trapezoid = trapezoids_[trapezoid_index];

  // Determine if the current search come from the first children of the trapezoids.
  const bool come_from_left = (from_index == trapezoid.above1)
                                                        || (from_index == trapezoid.below1);

  add_vertex_to_monochain(trapezoid, go_down, monochain);
  select_monotone_path(trapezoid_index, go_down, come_from_left);

  // Continue in the same direction.
  if (go_down) {
    build_monotone_chains(monochain, trapezoid.below1, trapezoid_index, true);
    build_monotone_chains(monochain, trapezoid.below2, trapezoid_index, true);
  } else {
    build_monotone_chains(monochain, trapezoid.above1, trapezoid_index, false);
    build_monotone_chains(monochain, trapezoid.above2, trapezoid_index, false);
  }
}